

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int memdbClose(sqlite3_file *pFile)

{
  ulong uVar1;
  int iVar2;
  sqlite3_io_methods *p;
  bool bVar3;
  void *p_00;
  sqlite3_mutex *psVar4;
  ulong uVar5;
  long lVar6;
  _func_void_sqlite3_mutex_ptr **pp_Var7;
  uint uVar8;
  ulong uVar9;
  
  p = pFile[1].pMethods;
  if (p->xUnlock == (_func_int_sqlite3_file_ptr_int *)0x0) {
    psVar4 = (sqlite3_mutex *)p->xTruncate;
    if (psVar4 == (sqlite3_mutex *)0x0) goto LAB_00130aae;
    pp_Var7 = &sqlite3Config.mutex.xMutexEnter;
  }
  else {
    bVar3 = true;
    uVar9 = 0;
    if (sqlite3Config.bCoreMutex == '\0') {
LAB_00130a1b:
      psVar4 = (sqlite3_mutex *)0x0;
    }
    else {
      psVar4 = (*sqlite3Config.mutex.xMutexAlloc)(0xb);
      if (psVar4 == (sqlite3_mutex *)0x0) goto LAB_00130a1b;
      (*sqlite3Config.mutex.xMutexEnter)(psVar4);
      bVar3 = false;
    }
    uVar5 = (ulong)memdb_g_0;
    if ((int)memdb_g_0 < 1) {
      uVar5 = uVar9;
    }
    do {
      if (uVar5 == uVar9) goto LAB_00130a8b;
      uVar1 = uVar9 + 1;
      lVar6 = uVar9 * 8;
      uVar9 = uVar1;
    } while (*(sqlite3_io_methods **)((long)memdb_g_1 + lVar6) != p);
    if ((sqlite3_mutex *)p->xTruncate != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexEnter)((sqlite3_mutex *)p->xTruncate);
    }
    p_00 = memdb_g_1;
    if (*(int *)&p->xLock == 1) {
      lVar6 = (long)(int)memdb_g_0;
      uVar8 = memdb_g_0 - 1;
      memdb_g_0 = uVar8;
      *(undefined8 *)((long)memdb_g_1 + uVar1 * 8 + -8) =
           *(undefined8 *)((long)memdb_g_1 + lVar6 * 8 + -8);
      if (uVar8 == 0) {
        sqlite3_free(p_00);
        memdb_g_1 = (void *)0x0;
      }
    }
LAB_00130a8b:
    if (bVar3) goto LAB_00130aae;
    pp_Var7 = &sqlite3Config.mutex.xMutexLeave;
  }
  (**pp_Var7)(psVar4);
LAB_00130aae:
  iVar2 = *(int *)&p->xLock;
  *(int *)&p->xLock = iVar2 + -1;
  if (iVar2 < 2) {
    if (((ulong)p->xSync & 0x100000000) != 0) {
      sqlite3_free(p->xWrite);
    }
    if ((sqlite3_mutex *)p->xTruncate != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexLeave)((sqlite3_mutex *)p->xTruncate);
      if ((sqlite3_mutex *)p->xTruncate != (sqlite3_mutex *)0x0) {
        (*sqlite3Config.mutex.xMutexFree)((sqlite3_mutex *)p->xTruncate);
      }
    }
    sqlite3_free(p);
  }
  else if ((sqlite3_mutex *)p->xTruncate != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)((sqlite3_mutex *)p->xTruncate);
  }
  return 0;
}

Assistant:

static int memdbClose(sqlite3_file *pFile){
  MemStore *p = ((MemFile*)pFile)->pStore;
  if( p->zFName ){
    int i;
#ifndef SQLITE_MUTEX_OMIT
    sqlite3_mutex *pVfsMutex = sqlite3MutexAlloc(SQLITE_MUTEX_STATIC_VFS1);
#endif
    sqlite3_mutex_enter(pVfsMutex);
    for(i=0; ALWAYS(i<memdb_g.nMemStore); i++){
      if( memdb_g.apMemStore[i]==p ){
        memdbEnter(p);
        if( p->nRef==1 ){
          memdb_g.apMemStore[i] = memdb_g.apMemStore[--memdb_g.nMemStore];
          if( memdb_g.nMemStore==0 ){
            sqlite3_free(memdb_g.apMemStore);
            memdb_g.apMemStore = 0;
          }
        }
        break;
      }
    }
    sqlite3_mutex_leave(pVfsMutex);
  }else{
    memdbEnter(p);
  }
  p->nRef--;
  if( p->nRef<=0 ){
    if( p->mFlags & SQLITE_DESERIALIZE_FREEONCLOSE ){
      sqlite3_free(p->aData);
    }
    memdbLeave(p);
    sqlite3_mutex_free(p->pMutex);
    sqlite3_free(p);
  }else{
    memdbLeave(p);
  }
  return SQLITE_OK;
}